

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxmerge.cpp
# Opt level: O3

FILE * open_file(char *filename,char *mode)

{
  FILE *pFVar1;
  
  pFVar1 = fopen(filename,mode);
  return (FILE *)pFVar1;
}

Assistant:

FILE * open_file(const char *filename, const char *mode)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
    FILE * fp;
    if (0 != fopen_s(&fp, filename, mode))
        fp = 0;
#else
    FILE * fp = fopen(filename, mode);
#endif
    return fp;
}